

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_engine.c
# Opt level: O2

void HTS_Engine_save_generated_parameter(HTS_Engine *engine,size_t stream_index,FILE *fp)

{
  undefined8 in_RAX;
  size_t sVar1;
  ulong vector_index;
  ulong frame_index;
  HTS_GStreamSet *gss;
  double dVar2;
  undefined4 uStack_38;
  float temp;
  
  gss = &engine->gss;
  frame_index = 0;
  _uStack_38 = in_RAX;
  while( true ) {
    sVar1 = HTS_GStreamSet_get_total_frame(gss);
    if (sVar1 <= frame_index) break;
    vector_index = 0;
    while( true ) {
      sVar1 = HTS_GStreamSet_get_vector_length(gss,stream_index);
      if (sVar1 <= vector_index) break;
      dVar2 = HTS_GStreamSet_get_parameter(gss,stream_index,frame_index,vector_index);
      _uStack_38 = CONCAT44((float)dVar2,uStack_38);
      fwrite(&temp,4,1,(FILE *)fp);
      vector_index = vector_index + 1;
    }
    frame_index = frame_index + 1;
  }
  return;
}

Assistant:

void HTS_Engine_save_generated_parameter(HTS_Engine * engine, size_t stream_index, FILE * fp)
{
   size_t i, j;
   float temp;
   HTS_GStreamSet *gss = &engine->gss;

   for (i = 0; i < HTS_GStreamSet_get_total_frame(gss); i++)
      for (j = 0; j < HTS_GStreamSet_get_vector_length(gss, stream_index); j++) {
         temp = (float) HTS_GStreamSet_get_parameter(gss, stream_index, i, j);
         fwrite(&temp, sizeof(float), 1, fp);
      }
}